

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

String * __thiscall
kj::PathPtr::toString(String *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  char *__dest;
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  String *pSVar4;
  char *__src;
  char (*params) [2];
  Fault local_c8;
  Fault f;
  char **local_b8;
  undefined1 local_b0 [8];
  DebugComparison<char_*&,_char_*> _kjCondition;
  String *p_1;
  String *__end1_1;
  String *__begin1_1;
  ArrayPtr<const_kj::String> *__range1_1;
  bool leadingSlash;
  char *local_58;
  char *ptr;
  String *local_48;
  String *p;
  String *__end1;
  String *__begin1;
  ArrayPtr<const_kj::String> *__range1;
  size_t size;
  PathPtr *pPStack_18;
  bool absolute_local;
  PathPtr *this_local;
  String *result;
  
  size._7_1_ = absolute;
  pPStack_18 = this;
  this_local = (PathPtr *)__return_storage_ptr__;
  sVar3 = ArrayPtr<const_kj::String>::size(&this->parts);
  if (sVar3 == 0) {
    if ((size._7_1_ & 1) == 0) {
      str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x39b444,params);
    }
    else {
      str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x3c4d76,params);
    }
  }
  else {
    bVar1 = size._7_1_ & 1;
    sVar3 = ArrayPtr<const_kj::String>::size(&this->parts);
    __range1 = (ArrayPtr<const_kj::String> *)((ulong)bVar1 + (sVar3 - 1));
    __begin1 = (String *)this;
    __end1 = ArrayPtr<const_kj::String>::begin(&this->parts);
    p = ArrayPtr<const_kj::String>::end((ArrayPtr<const_kj::String> *)__begin1);
    for (; __end1 != p; __end1 = __end1 + 1) {
      local_48 = __end1;
      sVar3 = String::size(__end1);
      __range1 = (ArrayPtr<const_kj::String> *)((long)&__range1->ptr + sVar3);
    }
    ptr._7_1_ = 0;
    heapString(__return_storage_ptr__,(size_t)__range1);
    local_58 = String::begin(__return_storage_ptr__);
    __range1_1._3_1_ = size._7_1_ & 1;
    __end1_1 = ArrayPtr<const_kj::String>::begin(&this->parts);
    pSVar4 = ArrayPtr<const_kj::String>::end(&this->parts);
    for (; __end1_1 != pSVar4; __end1_1 = __end1_1 + 1) {
      _kjCondition._32_8_ = __end1_1;
      if (__range1_1._3_1_ != 0) {
        *local_58 = '/';
        local_58 = local_58 + 1;
      }
      __dest = local_58;
      __range1_1._3_1_ = 1;
      __src = String::begin(__end1_1);
      sVar3 = String::size((String *)_kjCondition._32_8_);
      memcpy(__dest,__src,sVar3);
      sVar3 = String::size((String *)_kjCondition._32_8_);
      local_58 = local_58 + sVar3;
    }
    local_b8 = (char **)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
    f.exception = (Exception *)String::end(__return_storage_ptr__);
    kj::_::DebugExpression<char*&>::operator==
              ((DebugComparison<char_*&,_char_*> *)local_b0,(DebugExpression<char*&> *)&local_b8,
               (char **)&f);
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
    if (!bVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
                (&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x9a,FAILED,"ptr == result.end()","_kjCondition,",
                 (DebugComparison<char_*&,_char_*> *)local_b0);
      kj::_::Debug::Fault::fatal(&local_c8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}